

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssignEvaluator.h
# Opt level: O0

void Eigen::internal::
     resize_if_allowed<Eigen::Ref<Eigen::Matrix<double,1,2,1,1,2>,0,Eigen::InnerStride<1>>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Matrix<double,1,2,1,1,2>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,2,1,1,2>const>const>,double,double>
               (Ref<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_0,_Eigen::InnerStride<1>_> *dst,
               CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_1,_2,_1,_1,_2>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>
               *src,assign_op<double,_double> *param_3)

{
  Index IVar1;
  Index cols;
  Index IVar2;
  bool bVar3;
  Index dstCols;
  Index dstRows;
  assign_op<double,_double> *param_2_local;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_1,_2,_1,_1,_2>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>
  *src_local;
  Ref<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_0,_Eigen::InnerStride<1>_> *dst_local;
  
  IVar1 = CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_1,_2,_1,_1,_2>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>
          ::rows(src);
  cols = CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_1,_2,_1,_1,_2>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>
         ::cols(src);
  IVar2 = MapBase<Eigen::Ref<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_0,_Eigen::InnerStride<1>_>,_0>::
          rows((MapBase<Eigen::Ref<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_0,_Eigen::InnerStride<1>_>,_0>
                *)dst);
  if (IVar2 == IVar1) {
    IVar2 = MapBase<Eigen::Ref<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_0,_Eigen::InnerStride<1>_>,_0>
            ::cols((MapBase<Eigen::Ref<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_0,_Eigen::InnerStride<1>_>,_0>
                    *)dst);
    if (IVar2 == cols) goto LAB_0032baad;
  }
  DenseBase<Eigen::Ref<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_0,_Eigen::InnerStride<1>_>_>::resize
            ((DenseBase<Eigen::Ref<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_0,_Eigen::InnerStride<1>_>_>
              *)dst,IVar1,cols);
LAB_0032baad:
  IVar2 = MapBase<Eigen::Ref<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_0,_Eigen::InnerStride<1>_>,_0>::
          rows((MapBase<Eigen::Ref<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_0,_Eigen::InnerStride<1>_>,_0>
                *)dst);
  bVar3 = false;
  if (IVar2 == IVar1) {
    IVar1 = MapBase<Eigen::Ref<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_0,_Eigen::InnerStride<1>_>,_0>
            ::cols((MapBase<Eigen::Ref<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_0,_Eigen::InnerStride<1>_>,_0>
                    *)dst);
    bVar3 = IVar1 == cols;
  }
  if (!bVar3) {
    __assert_fail("dst.rows() == dstRows && dst.cols() == dstCols",
                  "/workspace/llm4binary/github/license_c_cmakelists/oberbichler[P]ANurbs/external_libraries/Eigen/src/Core/AssignEvaluator.h"
                  ,0x2d1,
                  "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const internal::assign_op<T1, T2> &) [DstXprType = Eigen::Ref<Eigen::Matrix<double, 1, 2>>, SrcXprType = Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::Matrix<double, 1, 2>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, 1, 2>>>, T1 = double, T2 = double]"
                 );
  }
  return;
}

Assistant:

EIGEN_DEVICE_FUNC EIGEN_STRONG_INLINE
void resize_if_allowed(DstXprType &dst, const SrcXprType& src, const internal::assign_op<T1,T2> &/*func*/)
{
  Index dstRows = src.rows();
  Index dstCols = src.cols();
  if(((dst.rows()!=dstRows) || (dst.cols()!=dstCols)))
    dst.resize(dstRows, dstCols);
  eigen_assert(dst.rows() == dstRows && dst.cols() == dstCols);
}